

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void __thiscall
TreePropagator::walkBrokenBridges
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *reachable,
          vector<bool,_std::allocator<bool>_> *walked,vector<bool,_std::allocator<bool>_> *visited,
          int avoidBridge,vector<int,_std::allocator<int>_> *bridges,bool isArt,int parent)

{
  pointer pvVar1;
  long lVar2;
  int *piVar3;
  BoolView *pBVar4;
  bool bVar5;
  ulong uVar6;
  size_type __n;
  uint uVar7;
  int r_00;
  size_type __n_00;
  reference rVar8;
  int e;
  vector<bool,_std::allocator<bool>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar6 = (ulong)(uint)r;
  __n_00 = (size_type)r;
  local_50 = walked;
  local_48 = reachable;
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,__n_00);
  *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
  uVar7 = 0;
  local_38 = (ulong)isArt;
  local_40 = uVar6;
  do {
    pvVar1 = (this->super_GraphPropagator).adj.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[__n_00].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar1[__n_00].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar7) {
      return;
    }
    e = *(uint *)(lVar2 + (ulong)uVar7 * 4);
    piVar3 = (this->super_GraphPropagator).endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[e].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    r_00 = *piVar3;
    if (r_00 == (int)uVar6) {
      r_00 = piVar3[1];
    }
    if (((r_00 != avoidBridge || !isArt) && (isArt || e != avoidBridge)) && (r_00 != parent)) {
      pBVar4 = (this->super_GraphPropagator).es.data;
      __n = (size_type)r_00;
      if (sat.assigns.data[(uint)pBVar4[(uint)e].v] != '\0') {
        bVar5 = BoolView::isFalse(pBVar4 + (uint)e);
        if (bVar5) {
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](local_48,__n);
          if ((*rVar8._M_p & rVar8._M_mask) != 0) {
            rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](local_50,__n);
            if ((*rVar8._M_p & rVar8._M_mask) == 0) {
              rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,__n);
              if ((*rVar8._M_p & rVar8._M_mask) == 0) {
                std::vector<int,_std::allocator<int>_>::push_back(bridges,&e);
                uVar6 = local_40;
                goto LAB_0015d02f;
              }
            }
          }
        }
      }
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,__n);
      uVar6 = local_40;
      if ((*rVar8._M_p & rVar8._M_mask) == 0) {
        walkBrokenBridges(this,r_00,local_48,local_50,visited,avoidBridge,bridges,SUB81(local_38,0),
                          (int)local_40);
      }
    }
LAB_0015d02f:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TreePropagator::walkBrokenBridges(int r, std::vector<bool>& reachable,
																			 std::vector<bool>& walked, std::vector<bool>& visited,
																			 int avoidBridge, std::vector<edge_id>& bridges, bool isArt,
																			 int parent) {
	// cout << "Walking my island again.... :" << r<<" "<<avoidBridge<<endl;
	visited[r] = true;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (isArt && other == avoidBridge) {
			continue;
		}
		if (!isArt && e == avoidBridge) {
			continue;
		}
		if (other == parent) {
			continue;
		}
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			// cout << other<<" "<<reachable[other] <<" "<< walked[other]<<endl;
			if (reachable[other] && !walked[other] && !visited[other]) {
				bridges.push_back(e);
				continue;
			}
		}
		if (!visited[other]) {
			walkBrokenBridges(other, reachable, walked, visited, avoidBridge, bridges, isArt, r);
		}
	}
}